

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseDict
          (AsciiParser *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          *out_dict)

{
  bool bVar1;
  uint32_t uVar2;
  mapped_type *this_00;
  ostream *poVar3;
  char *pcVar4;
  char c;
  string key;
  MetaVariable var;
  string local_1c8;
  ostringstream ss_e;
  
  bVar1 = Expect(this,'{');
  if ((!bVar1) || (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), !bVar1)) {
    return false;
  }
  while (bVar1 = Eof(this), !bVar1) {
    bVar1 = Char1(this,&c);
    if (!bVar1) {
      return false;
    }
    if (c == '}') break;
    bVar1 = Rewind(this,1);
    if (!bVar1) {
      return false;
    }
    key._M_dataplus._M_p = (pointer)&key.field_2;
    key._M_string_length = 0;
    key.field_2._M_local_buf[0] = '\0';
    var._value.v_.vtable = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
    var._value.v_.storage.dynamic = (void *)0x0;
    var._name._M_dataplus._M_p = (pointer)&var._name.field_2;
    var._name._M_string_length = 0;
    var._name.field_2._M_local_buf[0] = '\0';
    bVar1 = ParseDictElement(this,&key,&var);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ParseDict");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x3c2);
      ::std::operator<<(poVar3," ");
      pcVar4 = "Failed to parse dict element.";
LAB_002afc90:
      poVar3 = ::std::operator<<((ostream *)&ss_e,pcVar4);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_1c8);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
LAB_002afcd7:
      MetaVariable::~MetaVariable(&var);
      ::std::__cxx11::string::_M_dispose();
      return false;
    }
    bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
    if (!bVar1) goto LAB_002afcd7;
    if ((var._value.v_.vtable != (vtable_type *)0x0) &&
       (uVar2 = (*(var._value.v_.vtable)->type_id)(), uVar2 == 1)) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar3 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ParseDict");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x3ca);
      ::std::operator<<(poVar3," ");
      pcVar4 = "Invalid Dict element(probably internal issue).";
      goto LAB_002afc90;
    }
    this_00 = ::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
              ::operator[](out_dict,&key);
    MetaVariable::operator=(this_00,&var);
    MetaVariable::~MetaVariable(&var);
    ::std::__cxx11::string::_M_dispose();
  }
  bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
  return bVar1;
}

Assistant:

bool AsciiParser::ParseDict(std::map<std::string, MetaVariable> *out_dict) {
  // '{' comment | (type name '=' value)+ '}'
  if (!Expect('{')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      std::string key;
      MetaVariable var;
      if (!ParseDictElement(&key, &var)) {
        PUSH_ERROR_AND_RETURN("Failed to parse dict element.");
      }

      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      if (!var.is_valid()) {
        PUSH_ERROR_AND_RETURN("Invalid Dict element(probably internal issue).");
      }

      DCOUT("Add to dict: " << key);
      (*out_dict)[key] = var;
    }
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  return true;
}